

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DatatypeValidator::getCanonicalRepresentation
          (DatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  XMLCh *pXVar1;
  MemoryManager *local_60;
  DatatypeValidator *temp;
  MemoryManager *toUse;
  bool toValidate_local;
  MemoryManager *memMgr_local;
  XMLCh *rawData_local;
  DatatypeValidator *this_local;
  
  local_60 = memMgr;
  if (memMgr == (MemoryManager *)0x0) {
    local_60 = this->fMemoryManager;
  }
  if (toValidate) {
    (*(this->super_XSerializable)._vptr_XSerializable[8])(this,rawData,0,local_60);
  }
  pXVar1 = XMLString::replicate(rawData,local_60);
  return pXVar1;
}

Assistant:

const XMLCh* DatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                          ,      MemoryManager* const memMgr
                                                          ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;

    if (toValidate)
    {
        DatatypeValidator *temp = (DatatypeValidator*) this;

        try
        {
            temp->validate(rawData, 0, toUse);    
        }
        catch (...)
        {
            return 0;
        }
    }

    return XMLString::replicate(rawData, toUse);
}